

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void nrn_list(Item *q1,Item *q2)

{
  int iVar1;
  List *pLVar2;
  Item *q2_00;
  long in_RSI;
  long in_RDI;
  Item *q;
  List **plist;
  Item *in_stack_ffffffffffffffe0;
  List **local_18;
  
  local_18 = (List **)0x0;
  q2_00 = (Item *)(ulong)((int)**(short **)(in_RDI + 8) - 0x157);
  switch(q2_00) {
  case (Item *)0x0:
    local_18 = (List **)0x0;
    mechname = *(char **)(*(long *)(in_RSI + 8) + 0x48);
    iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"POINT_PROCESS");
    if (iVar1 == 0) {
      point_process = 1;
    }
    else {
      iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"ARTIFICIAL_CELL");
      if (iVar1 == 0) {
        point_process = 1;
        artificial_cell = 1;
      }
    }
    set_suffix();
    break;
  case (Item *)0x7:
    for (in_stack_ffffffffffffffe0 = *(Item **)(in_RDI + 0x10);
        in_stack_ffffffffffffffe0 != *(Item **)(in_RSI + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->next) {
      ((in_stack_ffffffffffffffe0->element).sym)->nrntype =
           ((in_stack_ffffffffffffffe0->element).sym)->nrntype | 0x140;
    }
    local_18 = (List **)0x0;
    break;
  case (Item *)0x8:
    diag((char *)in_stack_ffffffffffffffe0,(char *)q2_00);
    break;
  case (Item *)0x9:
    local_18 = (List **)0x0;
    for (in_stack_ffffffffffffffe0 = *(Item **)(in_RDI + 0x10);
        in_stack_ffffffffffffffe0 != *(Item **)(in_RSI + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->next) {
      ((in_stack_ffffffffffffffe0->element).sym)->nrntype =
           ((in_stack_ffffffffffffffe0->element).sym)->nrntype | 8;
    }
    break;
  case (Item *)0xa:
    threadsafe((char *)0x10aa36);
    local_18 = &nrnpointers;
    for (in_stack_ffffffffffffffe0 = *(Item **)(in_RDI + 0x10);
        in_stack_ffffffffffffffe0 != *(Item **)(in_RSI + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->next) {
      ((in_stack_ffffffffffffffe0->element).sym)->nrntype =
           ((in_stack_ffffffffffffffe0->element).sym)->nrntype | 0x900;
    }
    break;
  case (Item *)0xb:
    threadsafe((char *)0x10aa97);
    local_18 = &nrnpointers;
    for (in_stack_ffffffffffffffe0 = *(Item **)(in_RDI + 0x10);
        in_stack_ffffffffffffffe0 != *(Item **)(in_RSI + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->next) {
      ((in_stack_ffffffffffffffe0->element).sym)->nrntype =
           ((in_stack_ffffffffffffffe0->element).sym)->nrntype | 0x2100;
    }
    use_bbcorepointer = 1;
    break;
  case (Item *)0xc:
    threadsafe((char *)0x10a9d5);
    for (in_stack_ffffffffffffffe0 = *(Item **)(in_RDI + 0x10);
        in_stack_ffffffffffffffe0 != *(Item **)(in_RSI + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->next) {
      ((in_stack_ffffffffffffffe0->element).sym)->nrntype =
           ((in_stack_ffffffffffffffe0->element).sym)->nrntype | 0x101;
    }
    local_18 = (List **)0x0;
    break;
  case (Item *)0x10:
    electrode_current = 1;
  case (Item *)0x1:
    local_18 = &currents;
    for (in_stack_ffffffffffffffe0 = *(Item **)(in_RDI + 0x10);
        in_stack_ffffffffffffffe0 != *(Item **)(in_RSI + 0x10);
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0->next) {
      ((in_stack_ffffffffffffffe0->element).sym)->nrntype =
           ((in_stack_ffffffffffffffe0->element).sym)->nrntype | 8;
    }
  }
  if (local_18 != (List **)0x0) {
    if (*local_18 == (List *)0x0) {
      pLVar2 = newlist();
      *local_18 = pLVar2;
    }
    if (in_RDI == in_RSI) {
      __assert_fail("q1 != q2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0x7d8,"void nrn_list()");
    }
    movelist(in_stack_ffffffffffffffe0,q2_00,(List *)0x10ab61);
  }
  return;
}

Assistant:

void nrn_list(q1, q2)
	Item *q1, *q2;
{
	List **plist = (List **)0;
	Item *q;
		
	switch (SYM(q1)->type) {
	case RANGE:
		plist = (List **)0;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNRANGE;
		}
		break;
	case SUFFIX:
		plist = (List **)0;
		mechname = SYM(q2)->name;
		if (strcmp(SYM(q1)->name, "POINT_PROCESS") == 0) {
			point_process = 1;
		}else if (strcmp(SYM(q1)->name, "ARTIFICIAL_CELL") == 0) {
			point_process = 1;
			artificial_cell = 1;
		}
		set_suffix();
		break;
	case ELECTRODE_CURRENT:
		electrode_current = 1;
	case NONSPECIFIC:
		plist = &currents;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNRANGE;
		}
		break;
	case SECTION:
		diag("NEURON SECTION variables not implemented", (char *)0);
		break;
	case GLOBAL:
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNGLOBAL | NRNNOTP;
		}
		plist = (List **)0;
		break;
	case EXTERNAL:
#if VECTORIZE
threadsafe("Use of EXTERNAL is not thread safe.");
#endif
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNEXTRN | NRNNOTP;
		}
		plist = (List **)0;
		break;
	case POINTER:
threadsafe("Use of POINTER is not thread safe.");
		plist = &nrnpointers;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNNOTP | NRNPOINTER;
		}
		break;
	case BBCOREPOINTER:
threadsafe("Use of BBCOREPOINTER is not thread safe.");
		plist = &nrnpointers;
		for (q = q1->next; q != q2->next; q = q->next) {
			SYM(q)->nrntype |= NRNNOTP | NRNBBCOREPOINTER;
		}
		use_bbcorepointer = 1;
		break;
	}
	if (plist) {
		if (!*plist) {
			*plist = newlist();
		}
		assert (q1 != q2);
		movelist(q1->next, q2, *plist);
	}
}